

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBeamIGAslider.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkBeamIGAslider::IntLoadConstraint_C
          (ChLinkBeamIGAslider *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  element_type *peVar4;
  element_type *peVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  undefined1 auVar9 [32];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ChVector<double> splinepoint;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_98;
  ChMatrix33<double> local_60;
  
  iVar8 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (c,recovery_clamp,this,CONCAT44(in_register_00000034,off_L),Qc,
                     CONCAT71(in_register_00000009,do_clamp));
  if ((char)iVar8 != '\0') {
    peVar4 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar3 = *(undefined1 (*) [32])(this->m_csys).rot.m_data;
    dVar1 = (this->m_csys).rot.m_data[1];
    auVar18._24_8_ = dVar1;
    auVar18._16_8_ = dVar1;
    dVar1 = (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1;
    auVar2 = *(undefined1 (*) [16])
              ((peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data + 2);
    auVar6 = vpermpd_avx2(auVar3,1);
    auVar7 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((this->m_csys).rot.m_data + 2)),0x15);
    auVar16._0_8_ = -dVar1;
    auVar16._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = -auVar2._0_8_;
    auVar14._8_8_ = -auVar2._8_8_;
    auVar12 = vunpcklpd_avx(auVar16,auVar12);
    auVar13._16_16_ = auVar2;
    auVar13._0_16_ = auVar12;
    auVar9._0_8_ = auVar6._0_8_ * auVar12._0_8_;
    auVar9._8_8_ = auVar6._8_8_ * auVar12._8_8_;
    auVar9._16_8_ = auVar6._16_8_ * auVar2._0_8_;
    auVar9._24_8_ = auVar6._24_8_ * auVar2._8_8_;
    dVar1 = (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
    auVar6._8_8_ = dVar1;
    auVar6._0_8_ = dVar1;
    auVar6._16_8_ = dVar1;
    auVar6._24_8_ = dVar1;
    auVar9 = vfmadd231pd_avx512vl(auVar9,auVar3,auVar6);
    dVar1 = (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
    auVar17._24_8_ = dVar1;
    auVar17._16_8_ = dVar1;
    dVar1 = (this->m_csys).rot.m_data[2];
    auVar18._8_8_ = dVar1;
    auVar18._0_8_ = dVar1;
    auVar3 = vpermpd_avx2(auVar13,0x66);
    auVar17._0_16_ = auVar14;
    auVar15._16_16_ = auVar16;
    auVar15._0_16_ = auVar14;
    auVar3 = vshufpd_avx(auVar15,auVar3,9);
    auVar6 = vpermpd_avx2(auVar17,0x24);
    auVar2 = vfmadd213pd_fma(auVar18,auVar6,auVar9);
    auVar2 = vfmadd213pd_fma(auVar3,auVar7,ZEXT1632(auVar2));
    local_98.m_data = (double  [4])ZEXT1632(auVar2);
    ChMatrix33<double>::ChMatrix33(&local_60,&local_98);
    local_98.m_data[2] = 0.0;
    local_98.m_data._0_16_ = ZEXT816(0);
    dVar10 = ChElementBeamIGA::GetU1
                       ((this->m_beams).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[this->active_element].
                        super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    dVar11 = ChElementBeamIGA::GetU2
                       ((this->m_beams).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[this->active_element].
                        super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    peVar5 = (this->m_beams).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->active_element].
             super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = this->tau - dVar10;
    (**(code **)(*(long *)&peVar5->super_ChElementBeam + 0xe8))
              ((dVar1 + dVar1) / (dVar11 - dVar10) + -1.0,peVar5,&local_98);
    peVar4 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ChTransform<double>::TransformLocalToParent
              (&(this->m_csys).pos,
               &(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  }
  return;
}

Assistant:

void ChLinkBeamIGAslider::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                              ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                              const double c,            // a scaling factor
                                              bool do_clamp,             // apply clamping to c*C?
                                              double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());

    ChVector<> splinepoint;
    double u1 = m_beams[this->active_element]->GetU1();
    double u2 = m_beams[this->active_element]->GetU2();
    double eta = (2.0 * (this->tau - u1) / (u2 - u1)) - 1.0;
    m_beams[this->active_element]->EvaluateSectionPoint(eta, splinepoint);
    ////GetLog() << "active_element = " << active_element << "\n";
    ////GetLog() << "tau = " << tau << "\n";
    ////GetLog() << "u1 = " << u1 << "\n";
    ////GetLog() << "u2 = " << u2 << "\n";
    ////GetLog() << "eta = " << eta << "\n";
    ////GetLog() << "point = " << splinepoint << "\n";
    ChVector<> res = Arw.transpose() * (splinepoint - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVector<> cres = res * c;
    ////GetLog() << "res = " << res << "\n";
    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    ////GetLog() << "cres = " << cres << "\n";
    ////Qc(off_L + 0) += cres.x();
    ////Qc(off_L + 0) += cres.y();
    ////Qc(off_L + 1) += cres.z();
}